

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

string * __thiscall
cmake::LogLevelToString_abi_cxx11_(string *__return_storage_ptr__,cmake *this,LogLevel level)

{
  LevelsPairArray *this_00;
  const_iterator pvVar1;
  const_iterator __last;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_Message::LogLevel> *ppVar2;
  allocator<char> local_69;
  string local_68;
  undefined1 local_41;
  undefined1 local_40 [8];
  string_view levelStrLowerCase;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_Message::LogLevel> *it;
  LevelsPairArray *levels;
  string *psStack_10;
  LogLevel level_local;
  string *levelStrUpperCase;
  
  levels._4_4_ = SUB84(this,0);
  psStack_10 = __return_storage_ptr__;
  this_00 = anon_unknown.dwarf_8dbd81::getStringToLogLevelPairs();
  pvVar1 = std::
           array<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_Message::LogLevel>,_7UL>
           ::cbegin(this_00);
  __last = std::
           array<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_Message::LogLevel>,_7UL>
           ::cend(this_00);
  levelStrLowerCase._M_str = (char *)((long)&levels + 4);
  ppVar2 = std::
           find_if<std::pair<std::basic_string_view<char,std::char_traits<char>>,Message::LogLevel>const*,cmake::LogLevelToString[abi:cxx11](Message::LogLevel)::__0>
                     (pvVar1,__last,(anon_class_8_1_a83b8aa4_for__M_pred)levelStrLowerCase._M_str);
  pvVar1 = std::
           array<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_Message::LogLevel>,_7UL>
           ::cend(this_00);
  if (ppVar2 == pvVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)local_40,"undefined");
  }
  else {
    local_40 = (undefined1  [8])(ppVar2->first)._M_len;
    levelStrLowerCase._M_len = (size_t)(ppVar2->first)._M_str;
  }
  local_41 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_68,(basic_string_view<char,_std::char_traits<char>_> *)local_40,
             &local_69);
  cmsys::SystemTools::UpperCase(__return_storage_ptr__,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  return __return_storage_ptr__;
}

Assistant:

std::string cmake::LogLevelToString(Message::LogLevel level)
{
  const LevelsPairArray& levels = getStringToLogLevelPairs();

  // NOLINTNEXTLINE(readability-qualified-auto)
  const auto it =
    std::find_if(levels.cbegin(), levels.cend(),
                 [&level](const LevelsPair& p) { return p.second == level; });
  const cm::string_view levelStrLowerCase =
    (it != levels.cend()) ? it->first : "undefined";
  std::string levelStrUpperCase =
    cmSystemTools::UpperCase(std::string{ levelStrLowerCase });
  return levelStrUpperCase;
}